

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::to_initializer_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRVariable *var)

{
  uint id;
  SPIRType *pSVar1;
  SPIRConstant *c;
  SPIRType *pSVar2;
  char *__rhs;
  string sStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pSVar1 = Compiler::get<spirv_cross::SPIRType>
                     ((Compiler *)this,*(uint32_t *)&(var->super_IVariant).field_0xc);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  id = (var->initializer).id;
  if (((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.ptr
       [id].type == TypeConstant) &&
     (((pSVar1->array).super_VectorView<unsigned_int>.buffer_size != 0 ||
      (pSVar1->basetype == Struct)))) {
    c = Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this,id);
    CompilerGLSL::constant_expression_abi_cxx11_(&sStack_68,&this->super_CompilerGLSL,c,false,false)
    ;
  }
  else {
    CompilerGLSL::to_initializer_expression_abi_cxx11_(&sStack_68,&this->super_CompilerGLSL,var);
  }
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_68);
  ::std::__cxx11::string::~string((string *)&sStack_68);
  pSVar2 = Compiler::expression_type((Compiler *)this,(var->initializer).id);
  if ((((pSVar1->array).super_VectorView<unsigned_int>.buffer_size == 0) &&
      (pSVar1->basetype != Struct)) && (pSVar1->vecsize < pSVar2->vecsize)) {
    __rhs = CompilerGLSL::vector_swizzle(pSVar1->vecsize,0);
    ::std::operator+(&local_48,__return_storage_ptr__,__rhs);
    CompilerGLSL::enclose_expression(&sStack_68,&this->super_CompilerGLSL,&local_48);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_68);
    ::std::__cxx11::string::~string((string *)&sStack_68);
    ::std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_initializer_expression(const SPIRVariable &var)
{
	// We risk getting an array initializer here with MSL. If we have an array.
	// FIXME: We cannot handle non-constant arrays being initialized.
	// We will need to inject spvArrayCopy here somehow ...
	auto &type = get<SPIRType>(var.basetype);
	string expr;
	if (ir.ids[var.initializer].get_type() == TypeConstant &&
	    (!type.array.empty() || type.basetype == SPIRType::Struct))
		expr = constant_expression(get<SPIRConstant>(var.initializer));
	else
		expr = CompilerGLSL::to_initializer_expression(var);
	// If the initializer has more vector components than the variable, add a swizzle.
	// FIXME: This can't handle arrays or structs.
	auto &init_type = expression_type(var.initializer);
	if (type.array.empty() && type.basetype != SPIRType::Struct && init_type.vecsize > type.vecsize)
		expr = enclose_expression(expr + vector_swizzle(type.vecsize, 0));
	return expr;
}